

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O2

int __thiscall Control::timeToActivate(Control *this,Network *network,int t,int tod)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = *(int *)&(this->super_Element).field_0x2c;
  if (iVar2 == 3) {
    iVar3 = this->time - tod;
    iVar2 = iVar3 + 0x15180;
    if (tod <= this->time) {
      iVar2 = iVar3;
    }
  }
  else if (iVar2 == 2) {
    iVar2 = this->time - t;
  }
  else {
    if (iVar2 != 0) {
      return -1;
    }
    iVar2 = Tank::timeToVolume((Tank *)this->node,this->volume);
  }
  if ((0 < iVar2) && (bVar1 = activate(this,false,(ostream *)&network->msgLog), bVar1)) {
    return iVar2;
  }
  return -1;
}

Assistant:

int Control::timeToActivate(Network* network, int t, int tod)
{
    Tank* tank;
    bool makeChange = false; //do not implement any control actions
    int  aTime = -1;
    switch (type)
    {
    case PRESSURE_LEVEL: break;

    case TANK_LEVEL:
        tank = static_cast<Tank*>(node);
        aTime = tank->timeToVolume(volume);
        break;

    case ELAPSED_TIME:
        aTime = time - t;
        break;

    case TIME_OF_DAY:
        if (time >= tod) aTime = time - tod;
        else aTime = 86400 - tod + time;
        break;
    }

    if ( aTime > 0 && activate(makeChange, network->msgLog) ) return aTime;
    else return -1;
}